

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O1

string_view __thiscall webfront::uri::URI::next(URI *this,string_view uri)

{
  ulong uVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  char *__str;
  bool bVar5;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = uri._M_str;
  local_20._M_len = uri._M_len;
  bVar5 = next::step == 7;
  next::step = next::step + 1;
  if (bVar5) {
    next::step = 0;
  }
  switch(next::step) {
  case 0:
    __str = "://";
    sVar2 = 3;
    goto LAB_00131bd4;
  case 1:
    sVar2 = next::mark + 3;
    if ((this->scheme)._M_len == 0) {
      sVar2 = 0;
    }
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_20,"/",sVar2,1)
    ;
    if (next::mark2 == 0xffffffffffffffff) {
      next::mark2 = local_20._M_len - 1;
    }
    else if ((this->scheme)._M_len != 0) {
      uVar4 = next::mark + 3;
      uVar3 = local_20._M_len - uVar4;
      if (local_20._M_len < uVar4) goto LAB_00131cf1;
      uVar1 = (next::mark2 - next::mark) - 3;
      goto LAB_00131bb5;
    }
    goto LAB_00131c85;
  case 2:
    sVar2 = next::mark2 + 1;
    if ((this->scheme)._M_len == 0) {
      sVar2 = 0;
    }
    next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_20,"?",sVar2,1);
    if ((next::mark != 0xffffffffffffffff) ||
       (next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_20,"#",0,1),
       next::mark != 0xffffffffffffffff)) {
      uVar3 = local_20._M_len - next::mark2;
      uVar4 = next::mark2;
      if (local_20._M_len < next::mark2) goto LAB_00131cf1;
      uVar1 = next::mark - next::mark2;
      goto LAB_00131bb5;
    }
    next::mark = local_20._M_len - 1;
    uVar4 = next::mark2;
LAB_00131ca2:
    uVar1 = local_20._M_len - uVar4;
    if (local_20._M_len < uVar4) {
LAB_00131cf1:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar4);
    }
    break;
  case 3:
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_20,"#",next::mark + 1,1);
    if (next::mark2 == 0xffffffffffffffff) {
      next::mark2 = local_20._M_len - 1;
      uVar4 = next::mark + 1;
      goto LAB_00131ca2;
    }
    uVar4 = next::mark + 1;
    uVar3 = local_20._M_len - uVar4;
    if (local_20._M_len < uVar4) goto LAB_00131cf1;
    uVar1 = next::mark2 + ~next::mark;
LAB_00131bb5:
    if (uVar3 < uVar1) {
      uVar1 = uVar3;
    }
    break;
  case 4:
    uVar4 = next::mark2 + 1;
    if (local_20._M_len < next::mark2 + 1) goto LAB_00131cf1;
LAB_00131b42:
    local_20._M_str = local_20._M_str + next::mark2 + 1;
    uVar1 = local_20._M_len - (next::mark2 + 1);
    goto LAB_00131caf;
  case 5:
    __str = "@";
    sVar2 = 1;
LAB_00131bd4:
    next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (&local_20,__str,0,sVar2);
    if (next::mark == 0xffffffffffffffff) {
switchD_00131a03_default:
      local_20._M_str = (char *)0x0;
      uVar1 = 0;
    }
    else {
      uVar1 = next::mark;
      if (local_20._M_len < next::mark) {
        uVar1 = local_20._M_len;
      }
    }
    goto LAB_00131caf;
  case 6:
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_20,":",next::mark + 1,1);
    uVar4 = next::mark + 1;
    if (next::mark2 == 0xffffffffffffffff) goto LAB_00131ca2;
    if (local_20._M_len < uVar4) goto LAB_00131cf1;
    uVar1 = next::mark2 + ~next::mark;
    if (local_20._M_len - uVar4 < next::mark2 + ~next::mark) {
      uVar1 = local_20._M_len - uVar4;
    }
    break;
  case 7:
    if (next::mark2 != 0xffffffffffffffff) {
      uVar4 = next::mark2 + 1;
      if (local_20._M_len <= next::mark2) goto LAB_00131cf1;
      goto LAB_00131b42;
    }
LAB_00131c85:
    local_20._M_str = (char *)0x0;
    uVar1 = 0;
    goto LAB_00131caf;
  default:
    goto switchD_00131a03_default;
  }
  local_20._M_str = local_20._M_str + uVar4;
LAB_00131caf:
  sVar6._M_str = local_20._M_str;
  sVar6._M_len = uVar1;
  return sVar6;
}

Assistant:

std::string_view next(std::string_view uri) const {
        static constexpr size_t schem{0}, autho{1}, path_{2}, quer_{3}, fragm{4}, usrnf{5}, host_{6}, port_{7}, npos = std::string_view::npos; 
        static size_t step{port_}, mark{0}, mark2{0};
        step = (step == port_) ? schem : step + 1;
        switch (step) {
            case schem: mark = uri.find("://"); return mark == npos ? std::string_view{} : uri.substr(0, mark);
            case autho: mark2 = uri.find("/", scheme.empty() ? 0 : mark + 3);
                if (mark2 == npos) { mark2 = uri.size() - 1; return {}; }
                if (scheme.empty()) return {};
                return uri.substr(mark + 3, mark2 - mark - 3);
            case path_: mark = uri.find("?", scheme.empty() ? 0 : mark2 + 1);
                if (mark == npos) {
                    mark = uri.find("#");
                    if (mark == npos) { mark = uri.size() - 1; return uri.substr(mark2); }
                }
                return uri.substr(mark2, mark - mark2);
            case quer_: mark2 = uri.find("#", mark + 1);
                if (mark2 == npos) { mark2 = uri.size() - 1; return uri.substr(mark + 1); } else return uri.substr(mark + 1, mark2 - mark - 1);
            case fragm: return uri.substr(mark2 + 1);
            case usrnf: mark = uri.find("@");
                if (mark == npos) return {}; else return uri.substr(0, mark);
            case host_: mark2 = uri.find(":", mark + 1);
                if (mark2 == npos) return uri.substr(mark + 1); else return uri.substr(mark + 1, mark2 - mark - 1);
            case port_: if (mark2 != npos) return uri.substr(mark2 + 1);
        }
        return {};           
    }